

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  Options options;
  Esperf esperf;
  Options local_158;
  Esperf local_60;
  
  paVar1 = &local_158.dict_filename_.field_2;
  local_158.num_threads_ = 1;
  local_158.num_recurrence_ = 1;
  local_158.interval_sec_ = 1;
  local_158.dict_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.dict_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.dict_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.dict_filename_._M_string_length = 0;
  local_158.dict_filename_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_158.http_method_.field_2;
  local_158.http_method_.field_2._M_allocated_capacity._0_4_ = 0x544547;
  local_158.http_method_._M_string_length = 3;
  paVar3 = &local_158.http_user_.field_2;
  local_158.http_user_._M_string_length = 0;
  local_158.http_user_.field_2._M_local_buf[0] = '\0';
  paVar4 = &local_158.http_header_.field_2;
  local_158.http_header_._M_string_length = 0;
  local_158.http_header_.field_2._M_local_buf[0] = '\0';
  paVar5 = &local_158.request_body_.field_2;
  local_158.request_body_._M_string_length = 0;
  local_158.request_body_.field_2._M_local_buf[0] = '\0';
  paVar6 = &local_158.request_url_.field_2;
  local_158.request_url_._M_string_length = 0;
  local_158.request_url_.field_2._M_local_buf[0] = '\0';
  local_158.verbose_ = false;
  local_158.poll_timeout = 100;
  local_158.dict_filename_._M_dataplus._M_p = (pointer)paVar1;
  local_158.http_method_._M_dataplus._M_p = (pointer)paVar2;
  local_158.http_user_._M_dataplus._M_p = (pointer)paVar3;
  local_158.http_header_._M_dataplus._M_p = (pointer)paVar4;
  local_158.request_body_._M_dataplus._M_p = (pointer)paVar5;
  local_158.request_url_._M_dataplus._M_p = (pointer)paVar6;
  iVar7 = Options::Parse(&local_158,argc,argv);
  if (iVar7 == 0) {
    Esperf::Esperf(&local_60,&local_158);
    Esperf::Run(&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.request_url_._M_dataplus._M_p != paVar6) {
    operator_delete(local_158.request_url_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.request_body_._M_dataplus._M_p != paVar5) {
    operator_delete(local_158.request_body_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.http_header_._M_dataplus._M_p != paVar4) {
    operator_delete(local_158.http_header_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.http_user_._M_dataplus._M_p != paVar3) {
    operator_delete(local_158.http_user_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.http_method_._M_dataplus._M_p != paVar2) {
    operator_delete(local_158.http_method_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.dict_filename_._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.dict_filename_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158.dict_);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    // parse command line options_
    Options options;
    if (options.Parse(argc, argv) == EXIT_SUCCESS){
        // run esperf
        Esperf esperf(&options);
        esperf.Run();
    };

    return EXIT_SUCCESS;
}